

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O3

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
::GetNumElConnected(TPZFrontStructMatrix<TPZFrontSym<std::complex<double>_>,_std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>
                    *this,TPZVec<int> *numelconnected)

{
  TPZEquationFilter *this_00;
  TNode *pTVar1;
  int iVar2;
  TPZConnect *pTVar3;
  int64_t size;
  TPZCompMesh *pTVar4;
  long nelem;
  long lVar5;
  long lVar6;
  TPZManVector<long,_10> destindex;
  TPZManVector<long,_10> firstind;
  TPZManVector<long,_10> local_110;
  TPZManVector<long,_10> local_a0;
  
  (**(code **)(*(long *)(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
                        fMesh + 0x78))();
  pTVar4 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
  if (0 < (pTVar4->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements) {
    this_00 = &(this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.
               fEquationFilter;
    nelem = 0;
    do {
      pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar4->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      if (((pTVar3->fDependList == (TPZDepend *)0x0) &&
          ((pTVar3->field_2).fCompose.fIsCondensed == false)) && (-1 < pTVar3->fSequenceNumber)) {
        iVar2 = (int)pTVar3->fSequenceNumber;
        pTVar1 = (((this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh
                  )->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
        lVar5 = (long)pTVar1[iVar2].pos;
        lVar6 = (long)pTVar1[iVar2].dim;
        size = TPZEquationFilter::NumActive(this_00,lVar5,lVar6 + lVar5);
        if (size != 0) {
          if (size != lVar6) {
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/StrMatrix/TPZFrontStructMatrix.cpp"
                       ,0x27);
          }
          TPZManVector<long,_10>::TPZManVector(&local_a0,size);
          TPZManVector<long,_10>::TPZManVector(&local_110,size);
          if (0 < size) {
            lVar6 = 0;
            do {
              local_a0.super_TPZVec<long>.fStore[lVar6] = lVar6;
              local_110.super_TPZVec<long>.fStore[lVar6] = lVar6 + lVar5;
              lVar6 = lVar6 + 1;
            } while (size != lVar6);
          }
          TPZEquationFilter::Filter
                    (this_00,&local_a0.super_TPZVec<long>,&local_110.super_TPZVec<long>);
          if (0 < local_110.super_TPZVec<long>.fNElements) {
            lVar5 = 0;
            do {
              pTVar3 = TPZChunkVector<TPZConnect,_10>::operator[]
                                 (&(((this->super_TPZStructMatrixT<std::complex<double>_>).
                                     super_TPZStructMatrix.fMesh)->fConnectVec).
                                   super_TPZChunkVector<TPZConnect,_10>,nelem);
              numelconnected->fStore[local_110.super_TPZVec<long>.fStore[lVar5]] =
                   pTVar3->fNElConnected;
              lVar5 = lVar5 + 1;
            } while (lVar5 < local_110.super_TPZVec<long>.fNElements);
          }
          TPZManVector<long,_10>::~TPZManVector(&local_110);
          TPZManVector<long,_10>::~TPZManVector(&local_a0);
        }
      }
      nelem = nelem + 1;
      pTVar4 = (this->super_TPZStructMatrixT<std::complex<double>_>).super_TPZStructMatrix.fMesh;
    } while (nelem < (pTVar4->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements);
  }
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::GetNumElConnected(TPZVec <int> &numelconnected){
	int64_t ic;
	
	this->fMesh->ComputeNodElCon();
	
	for(ic=0; ic<this->fMesh->ConnectVec().NElements(); ic++) {
		TPZConnect &cn = this->fMesh->ConnectVec()[ic];
		if(cn.HasDependency() || cn.IsCondensed()) continue;
		int64_t seqn = cn.SequenceNumber();
		if(seqn < 0) continue;
		int64_t firsteq = this->fMesh->Block().Position(seqn);
		int64_t lasteq = firsteq+this->fMesh->Block().Size(seqn);
        int64_t numactive = this->fEquationFilter.NumActive(firsteq, lasteq);
		if(!numactive) continue;
        if (numactive != lasteq-firsteq) {
            DebugStop();
        }
        TPZManVector<int64_t> firstind(numactive),destindex(numactive);
        for (int64_t i = 0; i<numactive; i++) {
            firstind[i] = i;
            destindex[i] = firsteq+i;
        }
        this->fEquationFilter.Filter(firstind, destindex);
		for(int64_t ind=0;ind<destindex.size();ind++) 
			numelconnected[destindex[ind] ] = this->fMesh->ConnectVec()[ic].NElConnected();
	}
}